

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

PrepareResult __thiscall Statement::prepareInsert(Statement *this,string *str)

{
  char *pcVar1;
  pointer pbVar2;
  istream *piVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  PrepareResult PVar7;
  int iVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string token;
  string cpp;
  string username;
  string id;
  string keyword;
  string email;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  value_type local_280;
  char *local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)str,_S_out|_S_in);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_298,4);
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = 0;
  local_218 = &local_208;
  local_210 = 0;
  local_208 = 0;
  local_238 = &local_228;
  local_230 = 0;
  local_228 = 0;
  local_1d0 = 0;
  local_1c8 = 0;
  local_1d8 = &local_1c8;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_280,' ');
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_298,&local_280);
  }
  PVar7 = PrepareSyntaxError;
  if ((long)local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x80) {
LAB_00103a3f:
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return PVar7;
  }
  local_258 = &local_248;
  local_250 = 0;
  local_248 = 0;
  pcVar1 = local_298.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  piVar4 = __errno_location();
  iVar8 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(pcVar1,&local_260,10);
  if (local_260 == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_00103b27:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)(uint32_t)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_00103b27;
    if (*piVar4 == 0) {
      *piVar4 = iVar8;
    }
    (this->rowToInsert).id = (uint32_t)lVar5;
    pcVar1 = local_298.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    iVar8 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(pcVar1,&local_260,10);
    pbVar2 = local_298.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_260 != pcVar1) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar8;
        }
        PVar7 = PrepareNegativeId;
        if (-1 < (int)lVar5) {
          PVar7 = PrepareStringTooLong;
          if (local_298.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length < 0x20) {
            strcpy((this->rowToInsert).username,
                   local_298.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
            if (pbVar2[3]._M_string_length < 0x40) {
              strcpy((this->rowToInsert).email,pbVar2[3]._M_dataplus._M_p);
              PVar7 = PrepareSuccess;
            }
          }
        }
        if (local_258 != &local_248) {
          operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
        }
        goto LAB_00103a3f;
      }
      goto LAB_00103b3f;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00103b3f:
  uVar6 = std::__throw_out_of_range("stoi");
  if (*piVar4 == 0) {
    *piVar4 = iVar8;
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  _Unwind_Resume(uVar6);
}

Assistant:

PrepareResult Statement::prepareInsert(std::string str) {
	std::stringstream ss(str);
	std::string token;
	std::vector<std::string> tokens;
	tokens.reserve(4);
	std::string keyword, id, username, email;
	while (getline(ss, token, ' ')) {
		tokens.push_back(token);
	}
	if (tokens.size() != 4)
		return PrepareSyntaxError;

       std::string cpp;
	try {
		rowToInsert.id = stoi(tokens[1]);
	} catch(...) {
		return PrepareSyntaxError;
	}

	if (stoi(tokens[1]) < 0) {
		return PrepareNegativeId;
	}

	if (tokens[2].length() < 32) {
		strcpy(rowToInsert.username, tokens[2].c_str());
	} else {
		return PrepareStringTooLong;
	}

	if (tokens[3].length() < 64) {
		strcpy(rowToInsert.email, tokens[3].c_str());
	} else {
		return PrepareStringTooLong;
	}

	return PrepareSuccess;
}